

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

bool __thiscall CFG::containsNode(CFG *this,CfgNode *node)

{
  Type TVar1;
  Addr addr;
  CfgNode *pCVar2;
  CfgNode *tmp;
  CfgNode *node_local;
  CFG *this_local;
  
  if (node == (CfgNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    TVar1 = CfgNode::type(node);
    if (TVar1 == CFG_ENTRY) {
      this_local._7_1_ = node == this->m_entryNode;
    }
    else if (TVar1 == CFG_EXIT) {
      this_local._7_1_ = node == this->m_exitNode;
    }
    else if (TVar1 == CFG_HALT) {
      this_local._7_1_ = node == this->m_haltNode;
    }
    else {
      addr = CfgNode::node2addr(node);
      pCVar2 = nodeByAddr(this,addr);
      this_local._7_1_ = pCVar2 == node;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CFG::containsNode(CfgNode* node) {
	if (!node)
		return false;

	switch (node->type()) {
		case CfgNode::CFG_ENTRY:
			return node == m_entryNode;
		case CfgNode::CFG_EXIT:
			return node == m_exitNode;
		case CfgNode::CFG_HALT:
			return node == m_haltNode;
		default:
			CfgNode* tmp = CFG::nodeByAddr(CfgNode::node2addr(node));
			return tmp == node;
	}
}